

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

uint64_t getnumattrib(rnndb *db,char *file,int line,xmlAttr *attr)

{
  char *__s;
  char *pcVar1;
  ulonglong uVar2;
  int __base;
  char *cc;
  char *local_38;
  
  __s = getattrib(db,file,line,attr);
  pcVar1 = strchr(__s,0x78);
  __base = 0x10;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr(__s,0x58);
    __base = 0x10;
    if (pcVar1 == (char *)0x0) {
      __base = 10;
    }
  }
  uVar2 = strtoull(__s,&local_38,__base);
  if (*local_38 != '\0') {
    fprintf(_stderr,"%s:%d: invalid numeric value \"%s\" in attribute \"%s\"\n",file,
            (ulong)(uint)line,__s,attr->name);
    db->estatus = 1;
  }
  return uVar2;
}

Assistant:

static uint64_t getnumattrib (struct rnndb *db, char *file, int line, xmlAttr *attr) {
	char *c = getattrib(db, file, line, attr);
	char *cc;
	uint64_t res;
	if (strchr(c, 'x') || strchr(c, 'X'))
		res = strtoull(c, &cc, 16);
	else
		res = strtoull(c, &cc, 10);
	if (*cc)  {
		fprintf (stderr, "%s:%d: invalid numeric value \"%s\" in attribute \"%s\"\n", file, line, c, attr->name);
		db->estatus = 1;
	}
	return res;
}